

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

void __thiscall
zmq::routing_socket_base_t::xwrite_activated(routing_socket_base_t *this,pipe_t *pipe_)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_out_pipes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_out_pipes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if ((pipe_t *)p_Var1[1]._M_right == pipe_) goto LAB_001b32e8;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it != end",
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
          ,0x837);
  fflush(_stderr);
  zmq_abort("it != end");
LAB_001b32e8:
  if ((char)p_Var1[2]._M_color == _S_black) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!it->second.active",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
            ,0x838);
    fflush(_stderr);
    zmq_abort("!it->second.active");
  }
  *(undefined1 *)&p_Var1[2]._M_color = _S_black;
  return;
}

Assistant:

void zmq::routing_socket_base_t::xwrite_activated (pipe_t *pipe_)
{
    const out_pipes_t::iterator end = _out_pipes.end ();
    out_pipes_t::iterator it;
    for (it = _out_pipes.begin (); it != end; ++it)
        if (it->second.pipe == pipe_)
            break;

    zmq_assert (it != end);
    zmq_assert (!it->second.active);
    it->second.active = true;
}